

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes2ts.h
# Opt level: O0

void __thiscall libwebm::VpxPes2Ts::~VpxPes2Ts(VpxPes2Ts *this)

{
  VpxPes2Ts *this_local;
  
  ~VpxPes2Ts(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~VpxPes2Ts() = default;